

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell::createTest
          (TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell *this)

{
  Utest *this_00;
  TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                                  ,0x280);
  TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_Test::
  TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_Test
            ((TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_Test *)this_00);
  return this_00;
}

Assistant:

MSC_SWITCHED_TEST(MockSupport_c, NoExceptionsAreThrownWhenAMock_cCallFailed)
{
    TestTestingFixture fixture;

    fixture.setTestFunction(failedCallToMockC);
    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getFailureCount());
    // Odd behavior in Visual C++, destructor still gets called here
    CHECK(!destructorWasCalled);
}